

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void __thiscall
ktx::Command::parseCommandLine(Command *this,string *name,string *desc,int argc,char **argv)

{
  string sStack_328;
  string local_308;
  string local_2e8 [32];
  ParseResult args;
  Options commandOpts;
  ParseResult local_e8;
  
  std::__cxx11::string::_M_assign((string *)&this->super_Reporter);
  std::__cxx11::string::_M_assign((string *)&(this->super_Reporter).commandDescription);
  std::__cxx11::string::string((string *)&local_308,(string *)name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_328,"",(allocator<char> *)&args);
  cxxopts::Options::Options(&commandOpts,&local_308,&sStack_328);
  std::__cxx11::string::~string((string *)&sStack_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,"[OPTION...]",(allocator<char> *)&args);
  std::__cxx11::string::operator=((string *)&commandOpts.m_custom_help,local_2e8);
  std::__cxx11::string::~string(local_2e8);
  commandOpts.m_width = 100;
  (*this->_vptr_Command[3])(this,&commandOpts);
  args.m_keys._M_h._M_buckets = &args.m_keys._M_h._M_single_bucket;
  args.m_keys._M_h._M_bucket_count = 1;
  args.m_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  args.m_keys._M_h._M_element_count = 0;
  args.m_keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  args.m_keys._M_h._M_rehash_policy._4_4_ = 0;
  args.m_values._M_h._M_buckets = &args.m_values._M_h._M_single_bucket;
  args.m_keys._M_h._M_rehash_policy._M_next_resize = 0;
  args.m_keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
  args.m_values._M_h._M_bucket_count = 1;
  args.m_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  args.m_values._M_h._M_element_count = 0;
  args.m_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  args.m_values._M_h._M_rehash_policy._4_4_ = 0;
  args.m_values._M_h._M_rehash_policy._M_next_resize = 0;
  args.m_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  args.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cxxopts::Options::parse(&local_e8,&commandOpts,argc,argv);
  cxxopts::ParseResult::operator=(&args,&local_e8);
  cxxopts::ParseResult::~ParseResult(&local_e8);
  (*this->_vptr_Command[4])(this,&commandOpts,&args);
  cxxopts::ParseResult::~ParseResult(&args);
  cxxopts::Options::~Options(&commandOpts);
  return;
}

Assistant:

void Command::parseCommandLine(const std::string& name, const std::string& desc, int argc, char* argv[]) {
    commandName = name;
    commandDescription = desc;

    cxxopts::Options commandOpts(name, "");
    commandOpts.custom_help("[OPTION...]");
    commandOpts.set_width(CONSOLE_USAGE_WIDTH);
    initOptions(commandOpts); // virtual customization point

    cxxopts::ParseResult args;
    try {
        args = commandOpts.parse(argc, argv);
        processOptions(commandOpts, args); // virtual customization point

    } catch (const cxxopts::exceptions::parsing& ex) {
        fatal_usage("{}.", ex.what());
    }

#if defined(_WIN32) && defined(DEBUG)
    if (args["ld"].as<bool>())
        launchDebugger();
#endif
}